

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

int4 __thiscall TypeCode::compareBasic(TypeCode *this,TypeCode *op)

{
  type_metatype tVar1;
  type_metatype tVar2;
  FuncProto *pFVar3;
  ProtoModel *pPVar4;
  ProtoModel *pPVar5;
  size_t __n;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  iVar6 = (this->super_Datatype).size;
  iVar7 = (op->super_Datatype).size;
  if (iVar6 != iVar7) {
    return (uint)(iVar6 <= iVar7) * 2 + -1;
  }
  tVar1 = (op->super_Datatype).metatype;
  tVar2 = (this->super_Datatype).metatype;
  if (tVar2 == tVar1) {
    pFVar3 = op->proto;
    if (this->proto == (FuncProto *)0x0) {
      return (uint)(pFVar3 != (FuncProto *)0x0);
    }
    if (pFVar3 == (FuncProto *)0x0) {
      return -1;
    }
    pPVar4 = this->proto->model;
    pPVar5 = pFVar3->model;
    if (pPVar4 == (ProtoModel *)0x0) {
      if (pPVar5 != (ProtoModel *)0x0) {
        return 1;
      }
    }
    else {
      if (pPVar5 == (ProtoModel *)0x0) {
        return -1;
      }
      __n = (pPVar4->name)._M_string_length;
      bVar10 = true;
      if (__n == (pPVar5->name)._M_string_length) {
        if (__n == 0) {
          bVar10 = false;
        }
        else {
          iVar6 = bcmp((pPVar4->name)._M_dataplus._M_p,(pPVar5->name)._M_dataplus._M_p,__n);
          bVar10 = iVar6 != 0;
        }
      }
      if (bVar10) {
        iVar6 = std::__cxx11::string::compare((string *)&pPVar4->name);
        return iVar6 >> 0x1f | 1;
      }
    }
    iVar6 = (*this->proto->store->_vptr_ProtoStore[5])();
    iVar7 = (*op->proto->store->_vptr_ProtoStore[5])();
    if (iVar6 == iVar7) {
      uVar8 = this->proto->flags & 0x1c01;
      uVar9 = op->proto->flags & 0x1c01;
      if (uVar8 == uVar9) {
        return 2;
      }
      return -(uint)(uVar8 < uVar9) | 1;
    }
    bVar10 = iVar6 <= iVar7;
  }
  else {
    bVar10 = (int)tVar1 <= (int)tVar2;
  }
  return (uint)bVar10 * 2 + -1;
}

Assistant:

int4 TypeCode::compareBasic(const TypeCode *op) const

{
  if (size != op->getSize()) return (op->getSize() < size) ? -1 : 1;
  if (metatype != op->getMetatype()) return (metatype < op->getMetatype()) ? -1 : 1;

  if (proto == (FuncProto *)0) {
    if (op->proto == (FuncProto *)0) return 0;
    return 1;
  }
  if (op->proto == (FuncProto *)0)
    return -1;

  if (!proto->hasModel()) {
    if (op->proto->hasModel()) return 1;
  }
  else {
    if (!op->proto->hasModel()) return -1;
    const string &model1(proto->getModelName());
    const string &model2(op->proto->getModelName());
    if (model1 != model2)
      return (model1 < model2) ? -1 : 1;
  }
  int4 nump = proto->numParams();
  int4 opnump = op->proto->numParams();
  if (nump != opnump)
    return (opnump < nump) ? -1 : 1;
  uint4 flags = proto->getComparableFlags();
  uint4 opflags = op->proto->getComparableFlags();
  if (flags != opflags)
    return (flags < opflags) ? -1 : 1;

  return 2;			// Carry on with comparison of parameters
}